

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O2

void __thiscall
Assimp::ValidateDSProcess::DoValidation<aiMaterial>
          (ValidateDSProcess *this,aiMaterial **parray,uint size,char *firstName,char *secondName)

{
  ulong uVar1;
  ValidateDSProcess *this_00;
  
  if (size != 0) {
    if (parray == (aiMaterial **)0x0) {
      ReportError(this,"aiScene::%s is NULL (aiScene::%s is %i)",firstName,secondName);
    }
    this_00 = this;
    for (uVar1 = 0; size != uVar1; uVar1 = uVar1 + 1) {
      if (parray[uVar1] == (aiMaterial *)0x0) {
        ReportError(this_00,"aiScene::%s[%i] is NULL (aiScene::%s is %i)",firstName,
                    uVar1 & 0xffffffff,secondName,(ulong)size);
      }
      this_00 = this;
      Validate(this,parray[uVar1]);
    }
  }
  return;
}

Assistant:

inline
void ValidateDSProcess::DoValidation(T** parray, unsigned int size, const char* firstName, const char* secondName) {
    // validate all entries
    if (size)
    {
        if (!parray)
        {
            ReportError("aiScene::%s is NULL (aiScene::%s is %i)",
                firstName, secondName, size);
        }
        for (unsigned int i = 0; i < size;++i)
        {
            if (!parray[i])
            {
                ReportError("aiScene::%s[%i] is NULL (aiScene::%s is %i)",
                    firstName,i,secondName,size);
            }
            Validate(parray[i]);
        }
    }
}